

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ktx::convertUNORMSBits<ImageT<unsigned_short,2u>>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,ktx *this,
          unique_ptr<Image,_std::default_delete<Image>_> *image,uint32_t sBits,string_view swizzle)

{
  undefined4 in_register_0000000c;
  long lVar1;
  
  lVar1 = CONCAT44(in_register_0000000c,sBits);
  if (lVar1 != 0) {
    (**(code **)(**(long **)this + 0xa8))
              (*(long **)this,lVar1,swizzle._M_len,lVar1,swizzle._M_len,swizzle._M_str);
  }
  (**(code **)(**(long **)this + 0x40))
            (__return_storage_ptr__,*(long **)this,2,0x10,(ulong)image & 0xffffffff);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> convertUNORMSBits(const std::unique_ptr<Image>& image, uint32_t sBits, std::string_view swizzle = "") {
    using ComponentT = typename T::Color::value_type;
    static constexpr auto componentCount = T::Color::getComponentCount();
    static constexpr auto bytesPerComponent = sizeof(ComponentT);
    static constexpr auto bits = bytesPerComponent * 8;

    if (!swizzle.empty())
        image->swizzle(swizzle);

    return image->getUNORM(componentCount, bits, sBits);
}